

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceMgr.cpp
# Opt level: O3

void printSourceLine(raw_ostream *S,StringRef LineContents)

{
  char *pcVar1;
  void *pvVar2;
  char *in_RCX;
  void *pvVar3;
  void *pvVar4;
  void *extraout_RDX_00;
  void *pvVar5;
  void *extraout_RDX_01;
  char *pcVar6;
  uint uVar7;
  uint uVar8;
  StringRef Str;
  StringRef Str_00;
  void *extraout_RDX;
  
  pvVar3 = (void *)LineContents.Length;
  pcVar6 = LineContents.Data;
  pvVar5 = pvVar3;
  if ((uint)LineContents.Length != 0) {
    uVar7 = 0;
    uVar8 = 0;
    do {
      pvVar5 = (void *)(ulong)uVar7;
      if (pvVar3 < pvVar5 || (long)pvVar3 - (long)pvVar5 == 0) {
LAB_00d9ede4:
        if (pvVar3 < pvVar5) {
          __assert_fail("size() >= N && \"Dropping more elements than exist\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/StringRef.h"
                        ,0x281,"StringRef llvm::StringRef::drop_front(size_t) const");
        }
        Str_00.Data = pcVar6 + (long)pvVar5;
        Str_00.Length = (long)pvVar3 - (long)pvVar5;
        llvm::raw_ostream::operator<<(S,Str_00);
        pvVar5 = extraout_RDX_01;
        break;
      }
      in_RCX = pcVar6;
      pvVar2 = memchr(pcVar6 + (long)pvVar5,9,(long)pvVar3 - (long)pvVar5);
      if ((pvVar2 == (void *)0x0) ||
         (pvVar2 = (void *)((long)pvVar2 - (long)pcVar6), pvVar2 == (void *)0xffffffffffffffff))
      goto LAB_00d9ede4;
      pvVar4 = pvVar2;
      if (pvVar2 < pvVar5) {
        pvVar4 = pvVar5;
      }
      if (pvVar3 < pvVar2) {
        pvVar4 = pvVar3;
      }
      Str.Length = (long)pvVar4 - (long)pvVar5;
      Str.Data = pcVar6 + (long)pvVar5;
      llvm::raw_ostream::operator<<(S,Str);
      uVar8 = (uVar8 - uVar7) + (int)pvVar2;
      pvVar5 = extraout_RDX;
      do {
        pcVar1 = S->OutBufCur;
        if (pcVar1 < S->OutBufEnd) {
          in_RCX = pcVar1 + 1;
          S->OutBufCur = in_RCX;
          *pcVar1 = ' ';
        }
        else {
          llvm::raw_ostream::write(S,0x20,pvVar5,(size_t)in_RCX);
          pvVar5 = extraout_RDX_00;
        }
        uVar8 = uVar8 + 1;
      } while ((uVar8 & 7) != 0);
      uVar7 = (int)pvVar2 + 1;
    } while (uVar7 != (uint)LineContents.Length);
  }
  pcVar6 = S->OutBufCur;
  if (S->OutBufEnd <= pcVar6) {
    llvm::raw_ostream::write(S,10,pvVar5,(size_t)in_RCX);
    return;
  }
  S->OutBufCur = pcVar6 + 1;
  *pcVar6 = '\n';
  return;
}

Assistant:

static void printSourceLine(raw_ostream &S, StringRef LineContents) {
  // Print out the source line one character at a time, so we can expand tabs.
  for (unsigned i = 0, e = LineContents.size(), OutCol = 0; i != e; ++i) {
    size_t NextTab = LineContents.find('\t', i);
    // If there were no tabs left, print the rest, we are done.
    if (NextTab == StringRef::npos) {
      S << LineContents.drop_front(i);
      break;
    }

    // Otherwise, print from i to NextTab.
    S << LineContents.slice(i, NextTab);
    OutCol += NextTab - i;
    i = NextTab;

    // If we have a tab, emit at least one space, then round up to 8 columns.
    do {
      S << ' ';
      ++OutCol;
    } while ((OutCol % TabStop) != 0);
  }
  S << '\n';
}